

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<signed_char,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  char lvals [2];
  char local_7a [2];
  Value *local_78;
  Value local_70;
  
  local_78 = new_max;
  local_7a[0] = NumericStats::GetMin<signed_char>(lstats);
  local_7a[1] = NumericStats::GetMax<signed_char>(lstats);
  cVar3 = NumericStats::GetMin<signed_char>(rstats);
  cVar4 = NumericStats::GetMax<signed_char>(rstats);
  uVar11 = 0x7f;
  uVar7 = 0x80;
  bVar13 = true;
  lVar8 = 0;
  do {
    uVar9 = (int)(short)cVar3 * (int)local_7a[lVar8];
    rstats = (BaseStatistics *)((ulong)rstats & 0xff);
    if ((short)(char)uVar9 == (short)uVar9) {
      rstats = (BaseStatistics *)(ulong)uVar9;
    }
    cVar5 = (char)uVar11;
    uVar11 = uVar11 & 0xff;
    uVar6 = uVar11;
    if ((char)rstats < cVar5) {
      uVar6 = (uint)rstats;
    }
    cVar5 = (char)uVar7;
    uVar7 = uVar7 & 0xff;
    uVar12 = (uint)rstats;
    if ((char)rstats <= cVar5) {
      uVar12 = uVar7;
    }
    if ((short)(char)uVar9 == (short)uVar9) {
      uVar9 = (int)(short)local_7a[lVar8] * (int)(short)cVar4;
      bVar2 = false;
      do {
        bVar1 = bVar2;
        uVar7 = uVar12;
        uVar11 = uVar6;
        if (bVar1) break;
        uVar10 = uVar9 + 0x80 & 0xffff;
        rstats = (BaseStatistics *)((ulong)rstats & 0xff);
        if (uVar10 < 0x100) {
          rstats = (BaseStatistics *)(ulong)(uVar9 & 0xff);
        }
        cVar5 = (char)uVar11;
        uVar11 = uVar11 & 0xff;
        uVar6 = uVar11;
        if ((char)rstats < cVar5) {
          uVar6 = (uint)rstats;
        }
        cVar5 = (char)uVar7;
        uVar7 = uVar7 & 0xff;
        uVar12 = (uint)rstats;
        if ((char)rstats <= cVar5) {
          uVar12 = uVar7;
        }
        bVar2 = true;
      } while (uVar10 < 0x100);
    }
    else {
      bVar1 = false;
    }
    if (!bVar1) break;
    bVar13 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar13);
  if (bVar13 == false) {
    Value::Numeric(&local_70,type,(long)(char)uVar11);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)(char)uVar7);
    Value::operator=(local_78,&local_70);
    Value::~Value(&local_70);
  }
  return bVar13;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}